

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall
t_py_generator::generate_python_docstring
          (t_py_generator *this,ostream *out,t_doc *tdoc,t_struct *tstruct,char *subheader)

{
  t_doc *out_00;
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  allocator local_289;
  string local_288;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  t_field *local_1f8;
  t_field *p;
  t_field **local_1e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1e0
  ;
  const_iterator p_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0;
  byte local_31;
  char *pcStack_30;
  bool has_doc;
  char *subheader_local;
  t_struct *tstruct_local;
  t_doc *tdoc_local;
  ostream *out_local;
  t_py_generator *this_local;
  
  local_31 = 0;
  pcStack_30 = subheader;
  subheader_local = (char *)tstruct;
  tstruct_local = (t_struct *)tdoc;
  tdoc_local = (t_doc *)out;
  out_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1c0);
  bVar1 = t_doc::has_doc((t_doc *)tstruct_local);
  if (bVar1) {
    local_31 = 1;
    psVar5 = t_doc::get_doc_abi_cxx11_((t_doc *)tstruct_local);
    std::operator<<(&local_1b0,(string *)psVar5);
  }
  p_iter._M_current = (t_field **)t_struct::get_members((t_struct *)subheader_local);
  sVar2 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)p_iter._M_current);
  if (sVar2 != 0) {
    if ((local_31 & 1) != 0) {
      std::operator<<(&local_1b0,(string *)&::endl_abi_cxx11_);
    }
    local_31 = 1;
    poVar3 = std::operator<<(&local_1b0,pcStack_30);
    std::operator<<(poVar3,":\n");
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1e0);
    local_1e8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(p_iter._M_current);
    local_1e0._M_current = local_1e8;
    while( true ) {
      p = (t_field *)
          std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)p_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1e0,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&p);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1e0);
      local_1f8 = *pptVar4;
      poVar3 = std::operator<<(&local_1b0," - ");
      psVar5 = t_field::get_name_abi_cxx11_(local_1f8);
      std::operator<<(poVar3,(string *)psVar5);
      bVar1 = t_doc::has_doc(&local_1f8->super_t_doc);
      if (bVar1) {
        poVar3 = std::operator<<(&local_1b0,": ");
        psVar5 = t_doc::get_doc_abi_cxx11_(&local_1f8->super_t_doc);
        std::operator<<(poVar3,(string *)psVar5);
      }
      else {
        std::operator<<(&local_1b0,(string *)&::endl_abi_cxx11_);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_1e0);
    }
  }
  out_00 = tdoc_local;
  if ((local_31 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"\"\"\"\n",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"",&local_241);
    std::__cxx11::stringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"\"\"\"\n",&local_289);
    t_generator::generate_docstring_comment
              (&this->super_t_generator,(ostream *)out_00,&local_218,&local_240,&local_268,
               &local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void t_py_generator::generate_python_docstring(ostream& out,
                                               t_doc* tdoc,
                                               t_struct* tstruct,
                                               const char* subheader) {
  bool has_doc = false;
  stringstream ss;
  if (tdoc->has_doc()) {
    has_doc = true;
    ss << tdoc->get_doc();
  }

  const vector<t_field*>& fields = tstruct->get_members();
  if (fields.size() > 0) {
    if (has_doc) {
      ss << endl;
    }
    has_doc = true;
    ss << subheader << ":\n";
    vector<t_field*>::const_iterator p_iter;
    for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter) {
      t_field* p = *p_iter;
      ss << " - " << p->get_name();
      if (p->has_doc()) {
        ss << ": " << p->get_doc();
      } else {
        ss << endl;
      }
    }
  }

  if (has_doc) {
    generate_docstring_comment(out, "\"\"\"\n", "", ss.str(), "\"\"\"\n");
  }
}